

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  CClient *this;
  IKernel *pIVar3;
  IEngine *pIVar4;
  IConsole *pIVar5;
  IStorage *pIVar6;
  IConfigManager *pIVar7;
  IEngineSound *pIVar8;
  IEngineInput *pIVar9;
  IEngineTextRender *pIVar10;
  IEngineMap *pIVar11;
  IMapChecker *pIVar12;
  IEngineMasterServer *pIVar13;
  IEditor *pIVar14;
  IGameClient *pIVar15;
  undefined4 extraout_var;
  char *src;
  char **in_RSI;
  int in_EDI;
  long lVar16;
  byte bVar17;
  long in_FS_OFFSET;
  char **local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = in_RSI;
  local_3c = in_EDI;
  cmdline_fix(&local_3c,&local_48);
  bVar1 = 1 < local_3c;
  if ((1 < local_3c) && (iVar2 = str_comp("-d",local_48[1]), iVar2 != 0)) {
    lVar16 = 2;
    do {
      iVar2 = str_comp("--default",local_48[lVar16 + -1]);
      if ((iVar2 == 0) || (bVar1 = lVar16 < local_3c, local_3c <= lVar16)) break;
      iVar2 = str_comp("-d",local_48[lVar16]);
      lVar16 = lVar16 + 1;
    } while (iVar2 != 0);
  }
  iVar2 = secure_random_init();
  this = (CClient *)mem_alloc(0x2d9cb8);
  mem_zero(this,0x2d9cb8);
  CClient::CClient(this);
  pIVar3 = IKernel::Create();
  (**pIVar3->_vptr_IKernel)(pIVar3,"client",this);
  CClient::RegisterInterfaces(this);
  pIVar4 = CreateEngine("Teeworlds");
  pIVar5 = CreateConsole(2);
  pIVar6 = CreateStorage("Teeworlds",2,local_3c,local_48);
  pIVar7 = CreateConfigManager();
  pIVar8 = CreateEngineSound();
  pIVar9 = CreateEngineInput();
  pIVar10 = CreateEngineTextRender();
  pIVar11 = CreateEngineMap();
  pIVar12 = CreateMapChecker();
  pIVar13 = CreateEngineMasterServer();
  if (iVar2 == 0) {
    iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"engine",pIVar4);
    bVar17 = 1;
    if ((((((char)iVar2 != '\0') &&
          (iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"console",pIVar5), (char)iVar2 != '\0')) &&
         (iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"config",pIVar7), (char)iVar2 != '\0')) &&
        ((((iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"enginesound",pIVar8), (char)iVar2 != '\0' &&
           (iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"sound",pIVar8), (char)iVar2 != '\0')) &&
          ((iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"engineinput",pIVar9), (char)iVar2 != '\0' &&
           ((iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"input",pIVar9), (char)iVar2 != '\0' &&
            (iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"enginetextrender",pIVar10),
            (char)iVar2 != '\0')))))) &&
         (iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"textrender",pIVar10), (char)iVar2 != '\0')))) &&
       ((((iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"enginemap",pIVar11), (char)iVar2 != '\0' &&
          (iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"map",pIVar11), (char)iVar2 != '\0')) &&
         (iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"mapchecker",pIVar12), (char)iVar2 != '\0')) &&
        ((iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"enginemasterserver",pIVar13),
         (char)iVar2 != '\0' &&
         (iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"masterserver",pIVar13), (char)iVar2 != '\0')))))
       ) {
      pIVar14 = CreateEditor();
      iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"editor",pIVar14);
      if ((char)iVar2 != '\0') {
        pIVar15 = CreateGameClient();
        iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"gameclient",pIVar15);
        if ((char)iVar2 != '\0') {
          iVar2 = (**pIVar3->_vptr_IKernel)(pIVar3,"storage",pIVar6);
          bVar17 = (byte)iVar2 ^ 1;
        }
      }
    }
    if (bVar17 == 0) {
      (*(pIVar4->super_IInterface)._vptr_IInterface[2])(pIVar4);
      (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,2);
      (*(pIVar5->super_IInterface)._vptr_IInterface[2])(pIVar5);
      (*(pIVar13->super_IMasterServer).super_IInterface._vptr_IInterface[2])(pIVar13);
      (*(pIVar13->super_IMasterServer).super_IInterface._vptr_IInterface[4])(pIVar13);
      CClient::RegisterCommands(this);
      CClient::InitInterfaces(this);
      iVar2 = (*pIVar3->_vptr_IKernel[2])(pIVar3,"gameclient");
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                ((long *)CONCAT44(extraout_var,iVar2));
      if (!bVar1) {
        iVar2 = (*(pIVar5->super_IInterface)._vptr_IInterface[0x16])(pIVar5,"settings07.cfg");
        if ((char)iVar2 == '\0') {
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x16])(pIVar5,"settings.cfg");
        }
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x16])(pIVar5);
        if (1 < local_3c) {
          if (local_3c == 2) {
            src = str_startswith(local_48[1],"teeworlds:");
          }
          else {
            src = (char *)0x0;
          }
          if (src == (char *)0x0) {
            (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                      (pIVar5,(ulong)(local_3c - 1),local_48 + 1);
          }
          else {
            str_copy(this->m_aCmdConnect,src,0x100);
          }
        }
      }
      this->m_pConfig->m_ClLastVersionPlayed = 0x705;
      (*(pIVar7->super_IInterface)._vptr_IInterface[4])(pIVar7);
      (*(this->m_pEngine->super_IInterface)._vptr_IInterface[4])();
      dbg_msg("client","starting...");
      CClient::Run(this);
      (*(pIVar4->super_IInterface)._vptr_IInterface[3])(pIVar4);
      (*(pIVar7->super_IInterface)._vptr_IInterface[5])(pIVar7,0);
      (**(this->super_IClient).super_IInterface._vptr_IInterface)(this);
      mem_free(this);
      (*pIVar3->_vptr_IKernel[4])(pIVar3);
      (*(pIVar4->super_IInterface)._vptr_IInterface[1])(pIVar4);
      (*(pIVar5->super_IInterface)._vptr_IInterface[1])(pIVar5);
      if (pIVar6 != (IStorage *)0x0) {
        (*(pIVar6->super_IInterface)._vptr_IInterface[1])();
      }
      (*(pIVar7->super_IInterface)._vptr_IInterface[1])();
      if (pIVar8 != (IEngineSound *)0x0) {
        (*(pIVar8->super_ISound).super_IInterface._vptr_IInterface[1])();
      }
      if (pIVar9 != (IEngineInput *)0x0) {
        (*(pIVar9->super_IInput).super_IInterface._vptr_IInterface[1])(pIVar9);
      }
      if (pIVar10 != (IEngineTextRender *)0x0) {
        (*(pIVar10->super_ITextRender).super_IInterface._vptr_IInterface[1])();
      }
      if (pIVar11 != (IEngineMap *)0x0) {
        (*(pIVar11->super_IMap).super_IInterface._vptr_IInterface[1])();
      }
      if (pIVar12 != (IMapChecker *)0x0) {
        (*(pIVar12->super_IInterface)._vptr_IInterface[1])();
      }
      (*(pIVar13->super_IMasterServer).super_IInterface._vptr_IInterface[1])();
      cmdline_free(local_3c,local_48);
      iVar2 = 0;
    }
    else {
      iVar2 = -(uint)bVar17;
    }
  }
  else {
    dbg_msg("secure","could not initialize secure RNG");
    iVar2 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int main(int argc, const char **argv) // ignore_convention
#endif
{
	cmdline_fix(&argc, &argv);
#if defined(CONF_FAMILY_WINDOWS)
	bool QuickEditMode = false;
	for(int i = 1; i < argc; i++) // ignore_convention
	{
		if(str_comp("--quickeditmode", argv[i]) == 0) // ignore_convention
		{
			QuickEditMode = true;
		}
	}
#endif

	bool UseDefaultConfig = false;
	for(int i = 1; i < argc; i++) // ignore_convention
	{
		if(str_comp("-d", argv[i]) == 0 || str_comp("--default", argv[i]) == 0) // ignore_convention
		{
			UseDefaultConfig = true;
			break;
		}
	}

	bool RandInitFailed = secure_random_init() != 0;

	CClient *pClient = CreateClient();
	IKernel *pKernel = IKernel::Create();
	pKernel->RegisterInterface(pClient);
	pClient->RegisterInterfaces();

	// create the components
	int FlagMask = CFGFLAG_CLIENT;
	IEngine *pEngine = CreateEngine("Teeworlds");
	IConsole *pConsole = CreateConsole(FlagMask);
	IStorage *pStorage = CreateStorage("Teeworlds", IStorage::STORAGETYPE_CLIENT, argc, argv); // ignore_convention
	IConfigManager *pConfigManager = CreateConfigManager();
	IEngineSound *pEngineSound = CreateEngineSound();
	IEngineInput *pEngineInput = CreateEngineInput();
	IEngineTextRender *pEngineTextRender = CreateEngineTextRender();
	IEngineMap *pEngineMap = CreateEngineMap();
	IMapChecker *pMapChecker = CreateMapChecker();
	IEngineMasterServer *pEngineMasterServer = CreateEngineMasterServer();

	if(RandInitFailed)
	{
		dbg_msg("secure", "could not initialize secure RNG");
		return -1;
	}

	{
		bool RegisterFail = false;

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pEngine);
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pConsole);
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pConfigManager);

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineSound*>(pEngineSound)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<ISound*>(pEngineSound));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineInput*>(pEngineInput)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IInput*>(pEngineInput));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineTextRender*>(pEngineTextRender)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<ITextRender*>(pEngineTextRender));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineMap*>(pEngineMap)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IMap*>(pEngineMap));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pMapChecker);

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineMasterServer*>(pEngineMasterServer)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IMasterServer*>(pEngineMasterServer));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(CreateEditor());
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(CreateGameClient());
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pStorage);

		if(RegisterFail)
			return -1;
	}

	pEngine->Init();
	pConfigManager->Init(FlagMask);
	pConsole->Init();
	pEngineMasterServer->Init();
	pEngineMasterServer->Load();

	// register all console commands
	pClient->RegisterCommands();

	// init client's interfaces
	pClient->InitInterfaces();

	pKernel->RequestInterface<IGameClient>()->OnConsoleInit();

	if(!UseDefaultConfig)
	{
		// execute config file
		if(!pConsole->ExecuteFile(SETTINGS_FILENAME ".cfg"))
			pConsole->ExecuteFile("settings.cfg"); // fallback to legacy naming scheme

		// execute autoexec file
		pConsole->ExecuteFile("autoexec.cfg");

		// parse the command line arguments
		if(argc > 1) // ignore_convention
		{
			const char *pAddress = 0;
			if(argc == 2)
			{
				pAddress = str_startswith(argv[1], "teeworlds:");
			}
			if(pAddress)
			{
				pClient->ConnectOnStart(pAddress);
			}
			else
			{
				pConsole->ParseArguments(argc - 1, &argv[1]);
			}
		}
	}
#if defined(CONF_FAMILY_WINDOWS)
	CConfig *pConfig = pConfigManager->Values();
	bool HideConsole = false;
	#ifdef CONF_RELEASE
	if(!(pConfig->m_ShowConsoleWindow&2))
	#else
	if(!(pConfig->m_ShowConsoleWindow&1))
	#endif
	{
		HideConsole = true;
		FreeConsole();
	}
	else if(!QuickEditMode)
		dbg_console_init();
#endif

	pClient->DoVersionSpecificActions();

	// restore empty config strings to their defaults
	pConfigManager->RestoreStrings();

	pClient->Engine()->InitLogfile();

	// run the client
	dbg_msg("client", "starting...");
	pClient->Run();

	// wait for background jobs to finish
	pEngine->ShutdownJobs();

	// write down the config and quit
	pConfigManager->Save();

#if defined(CONF_FAMILY_WINDOWS)
	if(!HideConsole && !QuickEditMode)
		dbg_console_cleanup();
#endif
	// free components
	pClient->~CClient();
	mem_free(pClient);
	delete pKernel;
	delete pEngine;
	delete pConsole;
	delete pStorage;
	delete pConfigManager;
	delete pEngineSound;
	delete pEngineInput;
	delete pEngineTextRender;
	delete pEngineMap;
	delete pMapChecker;
	delete pEngineMasterServer;

	cmdline_free(argc, argv);
	return 0;
}